

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_dec(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  ulong uVar2;
  char *s_;
  size_t len_;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  basic_substring<const_char> bVar9;
  basic_substring<const_char> local_18;
  
  uVar5 = this->len;
  if (pos < uVar5) {
    s_ = this->str;
    bVar6 = s_[pos];
    bVar1 = bVar6 - 0x30;
    len_ = pos;
    if (bVar1 < 10) {
      do {
        if (uVar5 - 1 == len_) {
          if (uVar5 <= pos) goto LAB_001b557d;
          s_ = this->str;
          goto LAB_001b5582;
        }
        bVar6 = s_[len_ + 1];
        len_ = len_ + 1;
      } while ((byte)(bVar6 - 0x30) < 10);
    }
    if (bVar6 == 0x2e) {
      uVar3 = len_ + 1;
      if (uVar5 <= uVar3) {
LAB_001b5588:
        uVar4 = 0;
        if (uVar3 < uVar5) {
          uVar4 = uVar5;
        }
        if (9 < bVar1) {
          uVar5 = uVar4;
        }
        goto LAB_001b5582;
      }
      bVar7 = s_[uVar3];
      bVar6 = bVar7 - 0x30;
      bVar8 = bVar6 < 10;
      uVar4 = uVar3;
      if (bVar8) {
        uVar2 = len_ + 2;
        do {
          uVar4 = uVar2;
          if (uVar5 <= uVar4) goto LAB_001b5588;
          bVar7 = s_[uVar4];
          uVar2 = uVar4 + 1;
        } while ((byte)(bVar7 - 0x30) < 10);
      }
      len_ = uVar4;
      if ((bVar7 & 0xdf) == 0x45) goto LAB_001b54e6;
      if (((((bVar7 < 0x3c) && ((0x800120100002601U >> ((ulong)bVar7 & 0x3f) & 1) != 0)) ||
           (bVar7 == 0x7d)) || (bVar7 == 0x5d)) && ((bVar1 < 10 || (bVar6 < 10)))) {
        basic_substring(&local_18,s_,len_);
        s_ = local_18.str;
        uVar5 = local_18.len;
        goto LAB_001b5582;
      }
    }
    else if ((bVar6 & 0xdf) == 0x45) {
      bVar8 = false;
LAB_001b54e6:
      s_ = this->str;
      if ((!(bool)(9 < bVar1 & (bVar8 ^ 1U))) && (uVar3 = len_ + 2, uVar3 < uVar5)) {
        bVar6 = s_[uVar3];
        bVar1 = bVar6 - 0x30;
        if (bVar1 < 10) {
          do {
            if ((3 - uVar5) + uVar3 == 2) goto LAB_001b5582;
            bVar6 = s_[uVar3 + 1];
            uVar3 = uVar3 + 1;
          } while ((byte)(bVar6 - 0x30) < 10);
        }
        if ((bVar1 < 10) &&
           (((bVar6 < 0x3c && ((0x800120100002601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) ||
            ((bVar6 == 0x5d || (bVar6 == 0x7d)))))) {
          basic_substring(&local_18,s_,uVar3);
          s_ = local_18.str;
          uVar5 = local_18.len;
          goto LAB_001b5582;
        }
      }
    }
    else if (((((bVar6 < 0x3c) && ((0x800120100002601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) ||
              (bVar6 == 0x7d)) || (bVar6 == 0x5d)) && (bVar1 < 10)) {
      basic_substring(&local_18,s_,len_);
      s_ = local_18.str;
      uVar5 = local_18.len;
      goto LAB_001b5582;
    }
  }
  else {
LAB_001b557d:
    s_ = this->str;
  }
  uVar5 = 0;
LAB_001b5582:
  bVar9.len = uVar5;
  bVar9.str = s_;
  return bVar9;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_dec(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_dec;
            }
            else if(c == 'e' || c == 'E')
            {
                ++pos;
                goto power_part_dec;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_dec:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
            {
                fracchars = true;
            }
            else if(c == 'e' || c == 'E')
            {
                ++pos;
                goto power_part_dec;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_dec:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'e' || str[pos - 1] == 'E');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }